

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::WhileStatement(SQCompiler *this)

{
  undefined8 uVar1;
  undefined8 uVar2;
  SQInteger ntoresolve;
  SQUnsignedInteger SVar3;
  SQUnsignedInteger SVar4;
  SQFuncState *funcstate;
  SQInteger SVar5;
  SQUnsignedInteger SVar6;
  SQUnsignedInteger SVar7;
  long in_RDI;
  SQInteger unaff_retaddr;
  SQCompiler *in_stack_00000008;
  SQInteger oldouters;
  SQScope __oldscope__;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  SQCompiler *in_stack_00000070;
  SQInteger jmppos;
  SQInteger jzpos;
  longlong *in_stack_ffffffffffffff58;
  SQCompiler *in_stack_ffffffffffffff60;
  SQInteger in_stack_ffffffffffffff68;
  SQFuncState *in_stack_ffffffffffffff70;
  SQCompiler *this_00;
  SQInteger in_stack_ffffffffffffff78;
  SQCompiler *this_01;
  SQFuncState *in_stack_ffffffffffffff90;
  SQFuncState *this_02;
  SQInteger n;
  SQFuncState *pSVar8;
  
  ntoresolve = SQFuncState::GetCurrentPos((SQFuncState *)0x11f9d5);
  Lex(in_stack_ffffffffffffff60);
  Expect(in_stack_00000008,unaff_retaddr);
  CommaExpr(in_stack_ffffffffffffff60);
  Expect(in_stack_00000008,unaff_retaddr);
  SVar3 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x48));
  SVar4 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x60));
  pSVar8 = (SQFuncState *)0x0;
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  n = 0;
  sqvector<long_long>::push_back
            ((sqvector<long_long> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  this_01 = *(SQCompiler **)(in_RDI + 8);
  SQFuncState::PopTarget(in_stack_ffffffffffffff70);
  SQFuncState::AddInstruction
            (in_stack_ffffffffffffff90,(SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)this_01,
             in_stack_ffffffffffffff78,(SQInteger)in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  funcstate = (SQFuncState *)SQFuncState::GetCurrentPos((SQFuncState *)0x11fae5);
  uVar1 = *(undefined8 *)(in_RDI + 0xe8);
  uVar2 = *(undefined8 *)(in_RDI + 0xf0);
  *(undefined8 *)(in_RDI + 0xe8) = *(undefined8 *)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x11fb28);
  *(SQInteger *)(in_RDI + 0xf0) = SVar5;
  Statement(in_stack_00000070,__nbreaks__._7_1_);
  this_02 = *(SQFuncState **)(*(long *)(in_RDI + 8) + 0x1c8);
  SVar5 = SQFuncState::GetStackSize((SQFuncState *)0x11fb5c);
  if ((SVar5 != *(long *)(in_RDI + 0xf0)) &&
     (SQFuncState::SetStackSize(pSVar8,n),
     this_02 != *(SQFuncState **)(*(long *)(in_RDI + 8) + 0x1c8))) {
    SQFuncState::AddInstruction
              (this_02,(SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)this_01,
               in_stack_ffffffffffffff78,(SQInteger)in_stack_ffffffffffffff70,
               in_stack_ffffffffffffff68);
  }
  *(undefined8 *)(in_RDI + 0xe8) = uVar1;
  *(undefined8 *)(in_RDI + 0xf0) = uVar2;
  pSVar8 = *(SQFuncState **)(in_RDI + 8);
  SQFuncState::GetCurrentPos((SQFuncState *)0x11fbf9);
  SQFuncState::AddInstruction
            (this_02,(SQOpcode)((ulong)in_RDI >> 0x20),(SQInteger)this_01,in_stack_ffffffffffffff78,
             (SQInteger)in_stack_ffffffffffffff70,(SQInteger)pSVar8);
  this_00 = *(SQCompiler **)(in_RDI + 8);
  SQFuncState::GetCurrentPos((SQFuncState *)0x11fc43);
  SQFuncState::SetIntructionParam(this_02,in_RDI,(SQInteger)this_01,(SQInteger)funcstate);
  SVar6 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x48));
  SVar7 = sqvector<long_long>::size((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x60));
  if (0 < (long)(SVar7 - SVar4)) {
    ResolveContinues(this_00,pSVar8,ntoresolve,(SQInteger)in_stack_ffffffffffffff58);
  }
  if (0 < (long)(SVar6 - SVar3)) {
    ResolveBreaks(this_01,funcstate,(SQInteger)this_00);
  }
  sqvector<long_long>::pop_back((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x170));
  sqvector<long_long>::pop_back((sqvector<long_long> *)(*(long *)(in_RDI + 8) + 0x188));
  return;
}

Assistant:

void WhileStatement()
    {
        SQInteger jzpos, jmppos;
        jmppos = _fs->GetCurrentPos();
        Lex(); Expect(_SC('(')); CommaExpr(); Expect(_SC(')'));

        BEGIN_BREAKBLE_BLOCK();
        _fs->AddInstruction(_OP_JZ, _fs->PopTarget());
        jzpos = _fs->GetCurrentPos();
        BEGIN_SCOPE();

        Statement();

        END_SCOPE();
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1);
        _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);

        END_BREAKBLE_BLOCK(jmppos);
    }